

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::
checkDeviceBufferTypeIsTexture(ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_RDI;
  string *unaff_retaddr;
  char *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [16];
  DeviceBufferType *in_stack_ffffffffffffffe8;
  
  bVar1 = deviceBufferTypeIsTexture(in_RDI);
  if (!bVar1) {
    deviceBufferTypeName_abi_cxx11_(in_stack_ffffffffffffffe8);
    std::operator+(in_stack_ffffffffffffffa8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    exception(unaff_retaddr);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::checkDeviceBufferTypeIsTexture() {
  if (!deviceBufferTypeIsTexture()) {
    exception("ManagedBuffer has wrong type for this operation. Expected a Texture1d/2d/3d but is " +
              deviceBufferTypeName(deviceBufferType));
  }
}